

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Struct * __thiscall hdc::Parser::parse_struct(Parser *this)

{
  bool bVar1;
  Struct *this_00;
  reference pTVar2;
  IdentifierExpression *parent;
  Type *type_00;
  StructField *this_01;
  Struct *s;
  Type *type;
  Token name;
  Parser *this_local;
  
  name._40_8_ = this;
  Token::Token((Token *)&type);
  this_00 = (Struct *)operator_new(0x78);
  Struct::Struct(this_00);
  expect(this,TK_STRUCT);
  expect(this,TK_ID);
  pTVar2 = __gnu_cxx::
           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
           operator*(&this->matched);
  Struct::setName(this_00,pTVar2);
  bVar1 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar1) {
    parent = parse_identifier_expression(this);
    Struct::setSuperStruct(this_00,parent);
    expect(this,TK_RIGHT_PARENTHESIS);
  }
  expect(this,TK_COLON);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  bVar1 = match(this,TK_PASS);
  if (!bVar1) {
    while (bVar1 = match(this,TK_ID), bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::operator=((Token *)&type,pTVar2);
      expect(this,TK_COLON);
      type_00 = parse_type(this);
      expect(this,TK_NEWLINE);
      this_01 = (StructField *)operator_new(0x68);
      StructField::StructField(this_01,(Token *)&type,type_00);
      Struct::addField(this_00,this_01);
    }
  }
  expect(this,TK_END);
  Token::~Token((Token *)&type);
  return this_00;
}

Assistant:

Struct*Parser::parse_struct() {
    Token name;
    Type* type;
    Struct* s = new Struct();

    expect(TK_STRUCT);
    expect(TK_ID);
    s->setName(*matched);

    if (match(TK_LEFT_PARENTHESIS)) {
        s->setSuperStruct(parse_identifier_expression());
        expect(TK_RIGHT_PARENTHESIS);
    }

    expect(TK_COLON);
    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    if (match(TK_PASS)) {

    } else {
        while (match(TK_ID)) {
            name = *matched;
            expect(TK_COLON);
            type = parse_type();
            expect(TK_NEWLINE);
            s->addField(new StructField(name, type));
        }
    }

    expect(TK_END);

    return s;
}